

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

string * show_encryption_method_abi_cxx11_
                   (string *__return_storage_ptr__,encryption_method_e method)

{
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"unknown",&local_19);
  if (method < (e_aesv3|e_unknown)) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string
show_encryption_method(QPDF::encryption_method_e method)
{
    std::string result = "unknown";
    switch (method) {
    case QPDF::e_none:
        result = "none";
        break;
    case QPDF::e_unknown:
        result = "unknown";
        break;
    case QPDF::e_rc4:
        result = "RC4";
        break;
    case QPDF::e_aes:
        result = "AESv2";
        break;
    case QPDF::e_aesv3:
        result = "AESv3";
        break;
        // no default so gcc will warn for missing case
    }
    return result;
}